

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O0

Word32 L_shr(tetra_codec *st,Word32 L_var1,Word16 var2)

{
  uint uVar1;
  short in_DX;
  uint in_ESI;
  Word32 L_var_out;
  Word16 in_stack_ffffffffffffffea;
  Word32 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff0;
  
  if (in_DX < 0) {
    uVar1 = L_shl((tetra_codec *)CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_fffffffffffffff0)),
                  in_stack_ffffffffffffffec,in_stack_ffffffffffffffea);
  }
  else if (in_DX < 0x1f) {
    if ((int)in_ESI < 0) {
      uVar1 = (int)(in_ESI ^ 0xffffffff) >> ((byte)in_DX & 0x1f) ^ 0xffffffff;
    }
    else {
      uVar1 = (int)in_ESI >> ((byte)in_DX & 0x1f);
    }
  }
  else {
    uVar1 = 0;
    if ((int)in_ESI < 0) {
      uVar1 = 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

Word32 L_shr(tetra_codec* st, Word32 L_var1, Word16 var2)
  {
   Word32 L_var_out;

   if (var2 < 0)
     {
      L_var_out = L_shl(st, L_var1,(Word16)(-var2) );
     }
   else
     {
      if (var2 >= 31)
 {
  L_var_out = (L_var1 < 0L) ? -1 : 0;
 }
      else
 {
  if (L_var1<0)
    {
     L_var_out = ~((~L_var1) >> var2);
    }
  else
    {
     L_var_out = L_var1 >> var2;
    }
 }
     }
   return(L_var_out);
  }